

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall args::FlagBase::Match(FlagBase *this,char flag)

{
  bool bVar1;
  ostream *poVar2;
  ExtraError *this_00;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream problem;
  char flag_local;
  FlagBase *this_local;
  
  bVar1 = Matcher::Match(&this->matcher,flag);
  if (bVar1) {
    if ((((this->super_NamedBase).field_0x51 & 1) != 0) &&
       (((this->super_NamedBase).super_Base.matched & 1U) != 0)) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar2 = std::operator<<((ostream *)local_198,"Flag \'");
      poVar2 = std::operator<<(poVar2,flag);
      std::operator<<(poVar2,"\' was passed multiple times, but is only allowed to be passed once");
      this_00 = (ExtraError *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      ExtraError::ExtraError(this_00,&local_1c8);
      __cxa_throw(this_00,&ExtraError::typeinfo,ExtraError::~ExtraError);
    }
    (this->super_NamedBase).super_Base.matched = true;
    this_local = this;
  }
  else {
    this_local = (FlagBase *)0x0;
  }
  return this_local;
}

Assistant:

virtual FlagBase *Match(const char flag)
            {
                if (matcher.Match(flag))
                {
                    if (extraError && matched)
                    {
#ifdef ARGS_NOEXCEPT
                        error = Error::Extra;
#else
                        std::ostringstream problem;
                        problem << "Flag '" << flag << "' was passed multiple times, but is only allowed to be passed once";
                        throw ExtraError(problem.str());
#endif
                    }
                    matched = true;
                    return this;
                }
                return nullptr;
            }